

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char local_238 [8];
  char zDirname [513];
  int local_24;
  int fd;
  int ii;
  int *pFd_local;
  char *zFilename_local;
  
  sqlite3_snprintf(0x200,local_238,"%s",zFilename);
  sVar2 = strlen(local_238);
  local_24 = (int)sVar2;
  while( true ) {
    bVar3 = false;
    if (0 < local_24) {
      bVar3 = local_238[local_24] != '/';
    }
    if (!bVar3) break;
    local_24 = local_24 + -1;
  }
  if (local_24 < 1) {
    if (local_238[0] != '/') {
      local_238[0] = '.';
    }
    local_238[1] = 0;
  }
  else {
    local_238[local_24] = '\0';
  }
  iVar1 = robust_open(local_238,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    iVar1 = sqlite3CantopenError(0x9db1);
    zFilename_local._4_4_ = unixLogErrorAtLine(iVar1,"openDirectory",local_238,0x9db1);
  }
  else {
    zFilename_local._4_4_ = 0;
  }
  return zFilename_local._4_4_;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}